

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> * __thiscall
tinyusdz::Xformable::xformOpOrder
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__return_storage_ptr__,
          Xformable *this)

{
  pointer pXVar1;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *op;
  size_t i;
  ulong uVar2;
  long lVar3;
  string ss;
  value_type xformOp;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    pXVar1 = (this->xformOps).
             super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->xformOps).
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pXVar1) / 0x70) <= uVar2)
    break;
    ss._M_dataplus._M_p = (pointer)&ss.field_2;
    ss._M_string_length = 0;
    ss.field_2._M_local_buf[0] = '\0';
    XformOp::XformOp(&xformOp,(XformOp *)((long)&pXVar1->op_type + lVar3));
    op = extraout_RDX;
    if (xformOp.inverted == true) {
      std::__cxx11::string::append((char *)&ss);
      op = extraout_RDX_00;
    }
    tinyusdz::to_string_abi_cxx11_(&local_50,(tinyusdz *)&xformOp,op);
    std::__cxx11::string::append((string *)&ss);
    std::__cxx11::string::_M_dispose();
    if (xformOp.suffix._M_string_length != 0) {
      std::operator+(&local_50,":",&xformOp.suffix);
      std::__cxx11::string::append((string *)&ss);
      std::__cxx11::string::_M_dispose();
    }
    Token::Token((Token *)&local_50,&ss);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::emplace_back<tinyusdz::Token>
              (__return_storage_ptr__,(Token *)&local_50);
    std::__cxx11::string::_M_dispose();
    XformOp::~XformOp(&xformOp);
    std::__cxx11::string::_M_dispose();
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x70;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value::token> Xformable::xformOpOrder() const {
  std::vector<value::token> toks;

  for (size_t i = 0; i < xformOps.size(); i++) {
    std::string ss;

    auto xformOp = xformOps[i];

    if (xformOp.inverted) {
      ss += "!invert!";
    }
    ss += to_string(xformOp.op_type);
    if (!xformOp.suffix.empty()) {
      ss += ":" + xformOp.suffix;
    }

    toks.push_back(value::token(ss));
  }

  return toks;
}